

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::FlushLogFilesUnsafe(int min_severity)

{
  LogDestination *log;
  int i;
  int min_severity_local;
  
  for (log._0_4_ = min_severity; (int)log < 4; log._0_4_ = (int)log + 1) {
    if (*(LogFileObject **)(log_destinations_ + (long)(int)log * 8) != (LogFileObject *)0x0) {
      anon_unknown_10::LogFileObject::FlushUnlocked
                (*(LogFileObject **)(log_destinations_ + (long)(int)log * 8));
    }
  }
  return;
}

Assistant:

inline void LogDestination::FlushLogFilesUnsafe(int min_severity) {
  // assume we have the log_mutex or we simply don't care
  // about it
  for (int i = min_severity; i < NUM_SEVERITIES; i++) {
    LogDestination* log = log_destinations_[i];
    if (log != NULL) {
      // Flush the base fileobject_ logger directly instead of going
      // through any wrappers to reduce chance of deadlock.
      log->fileobject_.FlushUnlocked();
    }
  }
}